

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void dump_info(ostream *os,char *name,char *txt)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = std::cout;
  *(uint *)(explode::unpklite::data_offset + *(long *)(std::cout + -0x18)) =
       *(uint *)(explode::unpklite::data_offset + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0x20;
  poVar2 = std::operator<<((ostream *)&std::cout,(char *)os);
  poVar2 = std::operator<<(poVar2,":\t");
  poVar2 = std::operator<<(poVar2,name);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

PRIVATE void dump_info(std::ostream& os, const char* name, const char* txt)
{
	os << std::left << std::setw(32) << name << ":\t" << txt << std::endl;
}